

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase755::run(TestCase755 *this)

{
  size_t sVar1;
  Directory *pDVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  String *pSVar6;
  undefined4 extraout_var_02;
  StringPtr name;
  StringPtr name_00;
  PathPtr path;
  StringPtr text;
  StringPtr name_01;
  PathPtr path_00;
  ArrayPtr<const_kj::StringPtr> parts;
  StringPtr name_02;
  PathPtr path_01;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_02;
  StringPtr name_03;
  StringPtr name_04;
  PathPtr path_03;
  StringPtr text_00;
  ArrayPtr<const_kj::StringPtr> parts_01;
  PathPtr path_04;
  ArrayPtr<const_kj::StringPtr> parts_02;
  StringPtr name_05;
  StringPtr name_06;
  PathPtr path_05;
  StringPtr text_01;
  ArrayPtr<const_kj::StringPtr> parts_03;
  ArrayPtr<const_kj::StringPtr> parts_04;
  PathPtr path_06;
  DebugExpression<bool> _kjCondition_1;
  undefined7 uStack_127;
  Replacer<kj::Directory> *pRStack_120;
  Array<kj::String> local_108;
  undefined8 local_f0;
  Array<kj::String> local_e8;
  DebugComparison<kj::String,_const_char_(&)[9]> _kjCondition;
  bool _kjCondition_4;
  undefined7 uStack_8f;
  ReadableFile *local_88;
  Own<kj::Directory,_std::nullptr_t> dir;
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> replacer;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_58;
  TempDir tempDir;
  
  TempDir::TempDir(&tempDir);
  TempDir::get((TempDir *)&dir);
  pDVar2 = dir.ptr;
  name.content.size_ = 4;
  name.content.ptr = "foo";
  Path::Path((Path *)&_kjCondition,name);
  (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
            (&replacer,pDVar2,_kjCondition.left.content.ptr,_kjCondition.left.content.size_,1);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  iVar5 = (**(replacer.ptr)->_vptr_Replacer)();
  path.parts.ptr._4_4_ = extraout_var;
  path.parts.ptr._0_4_ = iVar5;
  name_00.content.size_ = 4;
  name_00.content.ptr = "bar";
  Path::Path((Path *)&_kjCondition,name_00);
  path.parts.size_ = (size_t)_kjCondition.left.content.ptr;
  Directory::openFile((Directory *)&local_108,path,(WriteMode)_kjCondition.left.content.size_);
  text.content.size_ = 9;
  text.content.ptr = "original";
  File::writeAll((File *)local_108.size_,text);
  Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&local_108);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  iVar5 = (**(replacer.ptr)->_vptr_Replacer)();
  path_00.parts.ptr._4_4_ = extraout_var_00;
  path_00.parts.ptr._0_4_ = iVar5;
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  Path::Path((Path *)&local_e8,name_01);
  path_00.parts.size_ = (size_t)local_e8.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&_kjCondition_4,path_00);
  ReadableFile::readAllText((String *)&_kjCondition_1,local_88);
  local_108.ptr = __kjCondition_1;
  local_108.size_ = (size_t)pRStack_120;
  __kjCondition_1 = (String *)0x0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&local_108,(char (*) [9])"original");
  Array<char>::~Array((Array<char> *)&local_108);
  Array<char>::~Array((Array<char> *)&_kjCondition_1);
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
            ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&_kjCondition_4);
  Array<kj::String>::~Array(&local_e8);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[84],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fa,ERROR,
               "\"failed: expected \" \"replacer->get().openFile(Path(\\\"bar\\\"))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [84])
                "failed: expected replacer->get().openFile(Path(\"bar\"))->readAllText() == \"original\""
               ,&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  pDVar2 = dir.ptr;
  _kjCondition.left.content.ptr = "foo";
  _kjCondition.left.content.size_ = 4;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x401abd;
  _kjCondition.right = (char (*) [9])&DAT_00000004;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_108,parts);
  iVar5 = (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[8])
                    (pDVar2,local_108.ptr,local_108.size_);
  __kjCondition_1 = (String *)(CONCAT71(uStack_127,(char)iVar5) ^ 1);
  Array<kj::String>::~Array(&local_108);
  if ((_kjCondition_1.value == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fb,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected !dir->exists(Path({\"foo\", \"bar\"}))",
               &_kjCondition_1);
  }
  Directory::Replacer<kj::Directory>::commit(replacer.ptr);
  iVar5 = (**(replacer.ptr)->_vptr_Replacer)();
  path_01.parts.ptr._4_4_ = extraout_var_01;
  path_01.parts.ptr._0_4_ = iVar5;
  name_02.content.size_ = 4;
  name_02.content.ptr = "bar";
  Path::Path((Path *)&local_e8,name_02);
  path_01.parts.size_ = (size_t)local_e8.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&_kjCondition_4,path_01);
  ReadableFile::readAllText((String *)&_kjCondition_1,local_88);
  local_108.ptr = __kjCondition_1;
  local_108.size_ = 0;
  __kjCondition_1 = (String *)0x0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&local_108,(char (*) [9])"original");
  Array<char>::~Array((Array<char> *)&local_108);
  Array<char>::~Array((Array<char> *)&_kjCondition_1);
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
            ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&_kjCondition_4);
  Array<kj::String>::~Array(&local_e8);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[84],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fe,ERROR,
               "\"failed: expected \" \"replacer->get().openFile(Path(\\\"bar\\\"))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [84])
                "failed: expected replacer->get().openFile(Path(\"bar\"))->readAllText() == \"original\""
               ,&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  pDVar2 = dir.ptr;
  local_108.ptr = (String *)0x423c58;
  local_108.size_ = (size_t)&DAT_00000004;
  local_108.disposer = (ArrayDisposer *)0x401abd;
  local_f0 = 4;
  parts_00.size_ = 2;
  parts_00.ptr = (StringPtr *)&local_108;
  Path::Path((Path *)&_kjCondition_4,parts_00);
  path_02.parts.size_._1_7_ = uStack_8f;
  path_02.parts.size_._0_1_ = _kjCondition_4;
  path_02.parts.ptr = (String *)pDVar2;
  ReadableDirectory::openFile((ReadableDirectory *)&local_58,path_02);
  ReadableFile::readAllText((String *)&local_e8,local_58.ptr);
  sVar1 = local_e8.size_;
  __kjCondition_1 = local_e8.ptr;
  local_e8.ptr = (String *)0x0;
  local_e8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&_kjCondition_1,(char (*) [9])"original");
  Array<char>::~Array((Array<char> *)&_kjCondition_1);
  Array<char>::~Array((Array<char> *)&local_e8);
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&local_58);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition_4);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ff,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"original\""
               ,&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t>::dispose(&replacer);
  pDVar2 = dir.ptr;
  name_03.content.size_ = 4;
  name_03.content.ptr = "foo";
  Path::Path((Path *)&_kjCondition,name_03);
  (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
            (&_kjCondition_1,pDVar2,_kjCondition.left.content.ptr,_kjCondition.left.content.size_,1)
  ;
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  pSVar6 = (String *)(*(code *)**(undefined8 **)sVar1)();
  name_04.content.size_ = 6;
  name_04.content.ptr = "corge";
  Path::Path((Path *)&_kjCondition,name_04);
  path_03.parts.size_ = (size_t)_kjCondition.left.content.ptr;
  path_03.parts.ptr = pSVar6;
  Directory::openFile((Directory *)&local_108,path_03,(WriteMode)_kjCondition.left.content.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)local_108.size_,text_00);
  Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&local_108);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[6])(&_kjCondition);
  if (_kjCondition.left.content.size_ == 1) {
    (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[6])(&local_108);
    local_e8.ptr = (String *)0x423c58;
    local_e8.size_ = (size_t)&DAT_00000004;
    bVar3 = String::operator==(local_108.ptr,(StringPtr *)&local_e8);
    Array<kj::String>::~Array(&local_108);
    Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
    _kjCondition_4 = bVar3;
    if (kj::_::Debug::minSeverity < 3 && !bVar3) {
LAB_0026f059:
      kj::_::Debug::log<char_const(&)[78],bool&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                 ,0x306,ERROR,
                 "\"failed: expected \" \"dir->listNames().size() == 1 && dir->listNames()[0] == \\\"foo\\\"\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected dir->listNames().size() == 1 && dir->listNames()[0] == \"foo\"",
                 &_kjCondition_4);
    }
  }
  else {
    Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
    _kjCondition_4 = false;
    if (kj::_::Debug::minSeverity < 3) goto LAB_0026f059;
  }
  bVar4 = (**(code **)(*(long *)sVar1 + 8))();
  _kjCondition.left.content.ptr = (char *)(CONCAT71(_kjCondition.left.content.ptr._1_7_,bVar4) ^ 1);
  if ((bVar4 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x307,ERROR,"\"failed: expected \" \"!replacer->tryCommit()\", _kjCondition",
               (char (*) [40])"failed: expected !replacer->tryCommit()",
               (DebugExpression<bool> *)&_kjCondition);
  }
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t>::dispose
            ((Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> *)&_kjCondition_1);
  pDVar2 = dir.ptr;
  local_108.ptr = (String *)0x423c58;
  local_108.size_ = (size_t)&DAT_00000004;
  local_108.disposer = (ArrayDisposer *)0x401abd;
  local_f0 = 4;
  parts_01.size_ = 2;
  parts_01.ptr = (StringPtr *)&local_108;
  Path::Path((Path *)&_kjCondition_4,parts_01);
  path_04.parts.size_._1_7_ = uStack_8f;
  path_04.parts.size_._0_1_ = _kjCondition_4;
  path_04.parts.ptr = (String *)pDVar2;
  ReadableDirectory::openFile((ReadableDirectory *)&replacer,path_04);
  ReadableFile::readAllText((String *)&local_e8,(ReadableFile *)replacer.ptr);
  sVar1 = local_e8.size_;
  __kjCondition_1 = local_e8.ptr;
  local_e8.ptr = (String *)0x0;
  local_e8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&_kjCondition_1,(char (*) [9])"original");
  Array<char>::~Array((Array<char> *)&_kjCondition_1);
  Array<char>::~Array((Array<char> *)&local_e8);
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
            ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&replacer);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition_4);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x30b,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"original\""
               ,&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  pDVar2 = dir.ptr;
  _kjCondition.left.content.ptr = "foo";
  _kjCondition.left.content.size_ = 4;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x401b93;
  _kjCondition.right = (char (*) [9])0x6;
  parts_02.size_ = 2;
  parts_02.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_108,parts_02);
  iVar5 = (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[8])
                    (pDVar2,local_108.ptr,local_108.size_);
  __kjCondition_1 = (String *)(CONCAT71(uStack_127,(char)iVar5) ^ 1);
  Array<kj::String>::~Array(&local_108);
  if ((_kjCondition_1.value == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x30c,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"corge\\\"}))\", _kjCondition"
               ,(char (*) [54])"failed: expected !dir->exists(Path({\"foo\", \"corge\"}))",
               &_kjCondition_1);
  }
  pDVar2 = dir.ptr;
  name_05.content.size_ = 4;
  name_05.content.ptr = "foo";
  Path::Path((Path *)&_kjCondition,name_05);
  (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
            (&_kjCondition_1,pDVar2,_kjCondition.left.content.ptr,_kjCondition.left.content.size_,2)
  ;
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  iVar5 = (***(_func_int ***)sVar1)();
  path_05.parts.ptr._4_4_ = extraout_var_02;
  path_05.parts.ptr._0_4_ = iVar5;
  name_06.content.size_ = 6;
  name_06.content.ptr = "corge";
  Path::Path((Path *)&_kjCondition,name_06);
  path_05.parts.size_ = (size_t)_kjCondition.left.content.ptr;
  Directory::openFile((Directory *)&local_108,path_05,(WriteMode)_kjCondition.left.content.size_);
  text_01.content.size_ = 7;
  text_01.content.ptr = "bazqux";
  File::writeAll((File *)local_108.size_,text_01);
  Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&local_108);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[6])(&_kjCondition);
  if (_kjCondition.left.content.size_ == 1) {
    (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[6])(&local_108);
    local_e8.ptr = (String *)0x423c58;
    local_e8.size_ = 4;
    bVar3 = String::operator==(local_108.ptr,(StringPtr *)&local_e8);
    Array<kj::String>::~Array(&local_108);
    Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
    _kjCondition_4 = bVar3;
    if (2 < kj::_::Debug::minSeverity || bVar3) goto LAB_0026f3c0;
  }
  else {
    Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
    _kjCondition_4 = false;
    if (2 < kj::_::Debug::minSeverity) goto LAB_0026f3c0;
  }
  kj::_::Debug::log<char_const(&)[78],bool&>
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
             ,0x312,ERROR,
             "\"failed: expected \" \"dir->listNames().size() == 1 && dir->listNames()[0] == \\\"foo\\\"\", _kjCondition"
             ,(char (*) [78])
              "failed: expected dir->listNames().size() == 1 && dir->listNames()[0] == \"foo\"",
             &_kjCondition_4);
LAB_0026f3c0:
  Directory::Replacer<kj::Directory>::commit((Replacer<kj::Directory> *)sVar1);
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t>::dispose
            ((Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> *)&_kjCondition_1);
  pDVar2 = dir.ptr;
  _kjCondition.left.content.ptr = "foo";
  _kjCondition.left.content.size_ = 4;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x401abd;
  _kjCondition.right = (char (*) [9])&DAT_00000004;
  parts_03.size_ = 2;
  parts_03.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_108,parts_03);
  iVar5 = (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[8])
                    (pDVar2,local_108.ptr,local_108.size_);
  __kjCondition_1 = (String *)(CONCAT71(uStack_127,(byte)iVar5) ^ 1);
  Array<kj::String>::~Array(&local_108);
  if (((byte)iVar5 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x317,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected !dir->exists(Path({\"foo\", \"bar\"}))",
               &_kjCondition_1);
  }
  local_108.ptr = (String *)0x423c58;
  local_108.size_ = (size_t)&DAT_00000004;
  local_108.disposer = (ArrayDisposer *)0x401b93;
  local_f0 = 6;
  parts_04.size_ = 2;
  parts_04.ptr = (StringPtr *)&local_108;
  Path::Path((Path *)&_kjCondition_4,parts_04);
  path_06.parts.size_._1_7_ = uStack_8f;
  path_06.parts.size_._0_1_ = _kjCondition_4;
  path_06.parts.ptr = (String *)dir.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&replacer,path_06);
  ReadableFile::readAllText((String *)&local_e8,(ReadableFile *)replacer.ptr);
  __kjCondition_1 = local_e8.ptr;
  local_e8.ptr = (String *)0x0;
  local_e8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[7]> *)&_kjCondition,
             (DebugExpression<kj::String> *)&_kjCondition_1,(char (*) [7])"bazqux");
  Array<char>::~Array((Array<char> *)&_kjCondition_1);
  Array<char>::~Array((Array<char> *)&local_e8);
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
            ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&replacer);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition_4);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x318,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"corge\\\"}))->readAllText() == \\\"bazqux\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"corge\"}))->readAllText() == \"bazqux\""
               ,(DebugComparison<kj::String,_const_char_(&)[7]> *)&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  Own<kj::Directory,_std::nullptr_t>::dispose(&dir);
  TempDir::~TempDir(&tempDir);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }